

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void error<String,char*>(char *fmtstr,String *args,char **args_1)

{
  allocator local_59;
  String local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)local_38,fmtstr,&local_59);
  format<String,char*>(&local_58,(String *)local_38,args,args_1);
  error(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._string._M_dataplus._M_p != &local_58._string.field_2) {
    operator_delete(local_58._string._M_dataplus._M_p);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}